

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall tt::LogFile::append(LogFile *this,char *logline,int len)

{
  bool bVar1;
  type mutex;
  MutexLockGuard local_28;
  MutexLockGuard lock;
  int len_local;
  char *logline_local;
  LogFile *this_local;
  
  lock.m_mutex._4_4_ = len;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_mutex);
  if (bVar1) {
    mutex = std::unique_ptr<tt::MutexLock,_std::default_delete<tt::MutexLock>_>::operator*
                      (&this->m_mutex);
    MutexLockGuard::MutexLockGuard(&local_28,mutex);
    append_unlocked(this,logline,lock.m_mutex._4_4_);
    MutexLockGuard::~MutexLockGuard(&local_28);
  }
  else {
    append_unlocked(this,logline,lock.m_mutex._4_4_);
  }
  return;
}

Assistant:

void tt::LogFile::append(const char* logline, int len){
	if(m_mutex){
		MutexLockGuard lock(*m_mutex);
		append_unlocked(logline,len);
	}else{
		append_unlocked(logline,len);
	}
}